

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O1

void test47(char *infile,char *password,char *outfile,char *xarg)

{
  int iVar1;
  FILE *__stream;
  char *wanted_objects [3];
  
  __stream = (FILE *)safe_fopen(outfile,"wb");
  iVar1 = qpdf_read(qpdf,infile,password);
  if (iVar1 == 0) {
    wanted_objects[2] = (char *)0x0;
    wanted_objects[0]._0_4_ = 0x10f73b;
    wanted_objects[0]._4_4_ = 0;
    wanted_objects[1]._0_4_ = 0x10f745;
    wanted_objects[1]._4_4_ = 0;
    qpdf_write_json(qpdf,2,write_to_file,__stream,2,2,xarg,wanted_objects);
    fclose(__stream);
    report_errors();
    return;
  }
  __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x524,"void test47(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test47(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    FILE* f = safe_fopen(outfile, "wb");
    assert(qpdf_read(qpdf, infile, password) == 0);
    char const* wanted_objects[] = {"obj:4 0 R", "trailer", NULL};
    qpdf_write_json(
        qpdf, 2, write_to_file, f, qpdf_dl_specialized, qpdf_sj_file, xarg, wanted_objects);
    fclose(f);
    report_errors();
}